

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void stbtt_Rasterize(stbtt__bitmap *result,float flatness_in_pixels,stbtt_vertex *vertices,
                    int num_verts,float scale_x,float scale_y,float shift_x,float shift_y,int x_off,
                    int y_off,int invert,void *userdata)

{
  float *scanline;
  undefined4 uVar1;
  undefined4 uVar2;
  stbtt__active_edge *psVar3;
  uchar uVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  stbtt__point *points;
  stbtt__edge *p_00;
  float *scanline_00;
  undefined8 *puVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  stbtt__edge *psVar12;
  stbtt__active_edge *psVar13;
  stbtt__active_edge *psVar14;
  int iVar15;
  uint uVar16;
  nk_allocator *alloc;
  int iVar17;
  stbtt__edge *psVar18;
  long lVar19;
  undefined8 *puVar20;
  float fVar21;
  undefined4 in_register_00000084;
  int iVar22;
  ulong uVar23;
  int iVar24;
  stbtt__bitmap *psVar25;
  nk_allocator *alloc_2;
  stbtt__active_edge *psVar26;
  void *p;
  bool bVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar33;
  float fVar34;
  undefined1 auVar32 [16];
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float y_bottom;
  float local_2c8;
  stbtt__active_edge *active;
  float local_294;
  float local_290;
  float local_28c;
  float y0;
  stbtt__point *local_278;
  stbtt__bitmap *local_270;
  undefined8 *local_268;
  float local_260;
  float local_25c;
  undefined1 local_258 [16];
  undefined8 local_248;
  stbtt__edge *local_240;
  float scanline_data [129];
  
  local_248 = CONCAT44(in_register_00000084,y_off);
  fVar31 = scale_y;
  if (scale_x <= scale_y) {
    fVar31 = scale_x;
  }
  uVar6 = 0;
  uVar11 = (ulong)(uint)num_verts;
  if (num_verts < 1) {
    uVar11 = uVar6;
  }
  uVar10 = 0;
  for (; uVar11 * 0xe - uVar6 != 0; uVar6 = uVar6 + 0xe) {
    uVar10 = (ulong)((int)uVar10 + (uint)((&vertices->type)[uVar6] == '\x01'));
  }
  if ((int)uVar10 != 0) {
    y0 = shift_y;
    lVar7 = (**(code **)((long)userdata + 8))(*userdata,0,uVar10 * 4);
    if (lVar7 != 0) {
      local_258._0_4_ = x_off;
      fVar28 = (flatness_in_pixels / fVar31) * (flatness_in_pixels / fVar31);
      points = (stbtt__point *)0x0;
      fVar31 = 0.0;
      iVar17 = 0;
      fVar21 = 0.0;
      local_270 = result;
      do {
        psVar25 = local_270;
        scanline_00 = scanline_data;
        if (iVar17 == 1) {
          points = (stbtt__point *)
                   (**(code **)((long)userdata + 8))(*userdata,0,(long)(int)fVar21 << 3);
          if (points == (stbtt__point *)0x0) {
            (**(code **)((long)userdata + 0x10))(*userdata,0);
            (**(code **)((long)userdata + 0x10))(*userdata,lVar7);
            return;
          }
        }
        else if (iVar17 == 2) {
          if (points == (stbtt__point *)0x0) {
            return;
          }
          iVar17 = 0;
          for (uVar11 = 0; uVar10 != uVar11; uVar11 = uVar11 + 1) {
            iVar17 = iVar17 + *(int *)(lVar7 + uVar11 * 4);
          }
          local_2c8 = scale_y;
          if (invert != 0) {
            local_2c8 = -scale_y;
          }
          iVar15 = 0;
          local_278 = points;
          p_00 = (stbtt__edge *)
                 (**(code **)((long)userdata + 8))(*userdata,0,(long)(iVar17 + 1) * 0x14);
          if (p_00 != (stbtt__edge *)0x0) {
            iVar17 = 0;
            for (uVar11 = 0; uVar11 != uVar10; uVar11 = uVar11 + 1) {
              iVar5 = *(int *)(lVar7 + uVar11 * 4);
              uVar23 = (ulong)(iVar5 - 1);
              iVar24 = iVar5;
              for (uVar6 = 0; iVar22 = (int)uVar23, (long)uVar6 < (long)iVar24; uVar6 = uVar6 + 1) {
                uVar23 = (ulong)iVar22;
                fVar31 = local_278[(long)iVar15 + uVar23].y;
                fVar21 = local_278[(long)iVar15 + uVar6].y;
                if ((fVar31 != fVar21) || (NAN(fVar31) || NAN(fVar21))) {
                  psVar12 = p_00 + iVar17;
                  p_00[iVar17].invert = 0;
                  if (invert == 0) {
                    if (fVar21 <= fVar31) goto LAB_0010ed15;
LAB_0010ed03:
                    psVar12->invert = 1;
                    uVar23 = uVar6;
                  }
                  else {
                    if (fVar21 < fVar31) goto LAB_0010ed03;
LAB_0010ed15:
                    iVar22 = (int)uVar6;
                  }
                  fVar29 = local_278[(long)iVar15 + (long)iVar22].x * scale_x + shift_x;
                  fVar33 = local_278[(long)iVar15 + (long)iVar22].y * local_2c8 + y0;
                  fVar34 = local_278[(long)iVar15 + uVar23].x * scale_x + shift_x;
                  fVar35 = local_278[(long)iVar15 + uVar23].y * local_2c8 + y0;
                  psVar12->x0 = fVar29;
                  psVar12->y0 = fVar33;
                  psVar12->x1 = fVar34;
                  psVar12->y1 = fVar35;
                  iVar17 = iVar17 + 1;
                  iVar24 = *(int *)(lVar7 + uVar11 * 4);
                }
                uVar23 = uVar6 & 0xffffffff;
              }
              iVar15 = iVar5 + iVar15;
            }
            stbtt__sort_edges_quicksort(p_00,iVar17);
            psVar12 = p_00;
            for (uVar11 = 1; (long)uVar11 < (long)iVar17; uVar11 = uVar11 + 1) {
              uVar1 = p_00[uVar11].x0;
              uVar2 = p_00[uVar11].y0;
              scanline_data[2] = (float)p_00[uVar11].invert;
              scanline_data[0] = p_00[uVar11].x1;
              scanline_data[1] = p_00[uVar11].y1;
              psVar18 = psVar12;
              for (uVar6 = uVar11; 0 < (long)uVar6; uVar6 = uVar6 - 1) {
                if (psVar18->y0 <= (float)uVar2) goto LAB_0010edd2;
                psVar18[1].invert = psVar18->invert;
                fVar31 = psVar18->y0;
                fVar21 = psVar18->x1;
                fVar28 = psVar18->y1;
                psVar18[1].x0 = psVar18->x0;
                psVar18[1].y0 = fVar31;
                psVar18[1].x1 = fVar21;
                psVar18[1].y1 = fVar28;
                psVar18 = psVar18 + -1;
              }
              uVar6 = 0;
LAB_0010edd2:
              iVar15 = (int)uVar6;
              if (uVar11 != (uVar6 & 0xffffffff)) {
                p_00[iVar15].x0 = (float)uVar1;
                p_00[iVar15].y0 = (float)uVar2;
                p_00[iVar15].x1 = scanline_data[0];
                p_00[iVar15].y1 = scanline_data[1];
                p_00[iVar15].invert = (int)scanline_data[2];
              }
              psVar12 = psVar12 + 1;
            }
            active = (stbtt__active_edge *)0x0;
            uVar11 = (ulong)(uint)psVar25->w;
            if (0x40 < psVar25->w) {
              scanline_00 = (float *)(**(code **)((long)userdata + 8))(*userdata,0,uVar11 * 8 + 4);
              uVar11 = (ulong)(uint)psVar25->w;
            }
            scanline = scanline_00 + (int)uVar11;
            iVar15 = psVar25->h;
            local_290 = (float)local_248;
            p_00[iVar17].y0 = (float)(iVar15 + (int)local_290) + 1.0;
            local_260 = (float)(int)local_258._0_4_;
            psVar26 = (stbtt__active_edge *)0x0;
            local_294 = 0.0;
            local_268 = (undefined8 *)0x0;
            fVar31 = 0.0;
            local_240 = p_00;
            while (puVar20 = local_268, (int)fVar31 < iVar15) {
              y0 = (float)(int)local_290;
              memset(scanline_00,0,(long)(int)uVar11 << 2);
              memset(scanline,0,(long)psVar25->w * 4 + 4);
              psVar12 = local_240;
              puVar20 = local_268;
              fVar28 = y0;
              fVar21 = local_294;
              psVar14 = (stbtt__active_edge *)&active;
              while (psVar13 = psVar14, psVar3 = psVar13->next, psVar3 != (stbtt__active_edge *)0x0)
              {
                psVar14 = psVar3;
                if (psVar3->ey <= fVar28) {
                  psVar13->next = psVar3->next;
                  psVar3->direction = 0.0;
                  psVar3->next = psVar26;
                  psVar14 = psVar13;
                  psVar26 = psVar3;
                }
              }
              bVar27 = (int)local_248 != 0;
              fVar30 = fVar28 + 1.0;
              local_28c = fVar31;
              for (; fVar37 = psVar12->y0, fVar37 <= fVar30; psVar12 = psVar12 + 1) {
                fVar43 = psVar12->y1;
                if ((fVar37 != fVar43) || (NAN(fVar37) || NAN(fVar43))) {
                  puVar8 = puVar20;
                  if (psVar26 == (stbtt__active_edge *)0x0) {
                    if (fVar21 == 0.0) {
                      psVar26 = (stbtt__active_edge *)0x0;
                      puVar8 = (undefined8 *)(**(code **)((long)userdata + 8))(*userdata,0,0x6408);
                      fVar28 = y0;
                      if (puVar8 == (undefined8 *)0x0) {
                        fVar21 = 0.0;
                        goto LAB_0010f0b9;
                      }
                      *puVar8 = puVar20;
                      fVar37 = psVar12->y0;
                      fVar43 = psVar12->y1;
                      fVar21 = 1.11964e-42;
                    }
                    else {
                      fVar21 = (float)((int)fVar21 + -1);
                    }
                    psVar26 = (stbtt__active_edge *)(puVar8 + (long)(int)fVar21 * 4 + 1);
                    psVar14 = (stbtt__active_edge *)0x0;
                  }
                  else {
                    psVar14 = psVar26->next;
                  }
                  fVar36 = psVar12->x0;
                  fVar38 = (psVar12->x1 - fVar36) / (fVar43 - fVar37);
                  psVar26->fdx = fVar38;
                  psVar26->fdy = (float)(-(uint)(fVar38 != 0.0) & (uint)(1.0 / fVar38));
                  psVar26->fx = ((fVar28 - fVar37) * fVar38 + fVar36) - local_260;
                  psVar26->direction = *(float *)(&DAT_00150488 + (ulong)(psVar12->invert == 0) * 4)
                  ;
                  psVar26->sy = fVar37;
                  psVar26->ey = fVar43;
                  psVar26->next = (stbtt__active_edge *)0x0;
                  if (fVar43 < fVar28 && (fVar31 == 0.0 && bVar27)) {
                    psVar26->ey = fVar28;
                  }
                  psVar26->next = active;
                  active = psVar26;
                  puVar20 = puVar8;
                  psVar26 = psVar14;
                }
LAB_0010f0b9:
              }
              local_294 = fVar21;
              local_240 = psVar12;
              local_268 = puVar20;
              if (active != (stbtt__active_edge *)0x0) {
                iVar17 = local_270->w;
                fVar31 = (float)iVar17;
                psVar14 = active;
                if (iVar17 < 1) {
                  iVar17 = 0;
                }
                for (; psVar14 != (stbtt__active_edge *)0x0; psVar14 = psVar14->next) {
                  fVar21 = psVar14->fx;
                  fVar37 = psVar14->fdx;
                  if ((fVar37 != 0.0) || (NAN(fVar37))) {
                    fVar38 = fVar37 + fVar21;
                    fVar43 = psVar14->sy;
                    fVar36 = (float)(~-(uint)(fVar28 < fVar43) & (uint)fVar21 |
                                    (uint)((fVar43 - fVar28) * fVar37 + fVar21) &
                                    -(uint)(fVar28 < fVar43));
                    if (0.0 <= fVar36) {
                      fVar39 = psVar14->ey;
                      fVar42 = (float)(-(uint)(fVar39 < fVar30) &
                                       (uint)((fVar39 - fVar28) * fVar37 + fVar21) |
                                      ~-(uint)(fVar39 < fVar30) & (uint)fVar38);
                      if (((0.0 <= fVar42) && (fVar36 < fVar31)) && (fVar42 < fVar31)) {
                        if (fVar43 <= fVar28) {
                          fVar43 = fVar28;
                        }
                        iVar15 = (int)fVar36;
                        if (fVar30 <= fVar39) {
                          fVar39 = fVar30;
                        }
                        iVar5 = (int)fVar42;
                        if (iVar15 == iVar5) {
                          lVar9 = (long)iVar15;
                          scanline_00[lVar9] =
                               (((fVar42 - (float)iVar15) + (fVar36 - (float)iVar15)) * -0.5 + 1.0)
                               * psVar14->direction * (fVar39 - fVar43) + scanline_00[lVar9];
                          fVar21 = (fVar39 - fVar43) * psVar14->direction;
                        }
                        else {
                          fVar37 = psVar14->fdy;
                          fVar41 = fVar42;
                          iVar24 = iVar15;
                          if (fVar42 < fVar36) {
                            fVar40 = fVar28 - fVar43;
                            fVar43 = (fVar28 - fVar39) + fVar30;
                            fVar37 = -fVar37;
                            fVar41 = fVar36;
                            fVar21 = fVar38;
                            iVar24 = iVar5;
                            iVar5 = iVar15;
                            fVar39 = fVar40 + fVar30;
                            fVar36 = fVar42;
                          }
                          iVar15 = iVar24 + 1;
                          fVar42 = ((float)iVar15 - fVar21) * fVar37 + fVar28;
                          fVar21 = psVar14->direction;
                          fVar38 = (fVar42 - fVar43) * fVar21;
                          scanline_00[iVar24] =
                               (1.0 - ((fVar36 - (float)iVar24) + 1.0) * 0.5) * fVar38 +
                               scanline_00[iVar24];
                          lVar9 = (long)iVar5;
                          for (lVar19 = (long)iVar15; lVar19 < lVar9; lVar19 = lVar19 + 1) {
                            scanline_00[lVar19] =
                                 fVar37 * fVar21 * 0.5 + fVar38 + scanline_00[lVar19];
                            fVar38 = fVar38 + fVar37 * fVar21;
                          }
                          scanline_00[lVar9] =
                               (fVar39 - (fVar37 * (float)(iVar5 - iVar15) + fVar42)) *
                               (((fVar41 - (float)iVar5) + 0.0) * -0.5 + 1.0) * fVar21 + fVar38 +
                               scanline_00[lVar9];
                          fVar21 = (fVar39 - fVar43) * fVar21;
                        }
                        scanline[lVar9 + 1] = fVar21 + scanline[lVar9 + 1];
                        goto LAB_0010f613;
                      }
                    }
                    local_258 = ZEXT416((uint)fVar21);
                    local_25c = fVar37;
                    iVar15 = 0;
                    while (iVar17 != iVar15) {
                      fVar43 = (float)iVar15;
                      fVar36 = (float)(iVar15 + 1);
                      fVar37 = (fVar43 - fVar21) / local_25c + fVar28;
                      fVar39 = (fVar36 - fVar21) / local_25c + fVar28;
                      if ((fVar43 <= fVar21) || (fVar38 <= fVar36)) {
                        if ((fVar43 <= fVar38) || (fVar21 <= fVar36)) {
                          if (((fVar43 <= fVar21) || (fVar38 <= fVar43)) &&
                             ((fVar43 <= fVar38 || (fVar21 <= fVar43)))) {
                            if (((fVar21 < fVar36) && (fVar36 < fVar38)) ||
                               ((fVar37 = fVar28, fVar43 = fVar21, fVar38 < fVar36 &&
                                (fVar36 < fVar21)))) goto LAB_0010f31a;
                            goto LAB_0010f3d5;
                          }
                        }
                        else {
                          stbtt__handle_clipped_edge
                                    (scanline_00,iVar15,psVar14,fVar21,fVar28,fVar36,fVar39);
                          fVar28 = fVar39;
                          fVar21 = fVar36;
                        }
                        stbtt__handle_clipped_edge
                                  (scanline_00,iVar15,psVar14,fVar21,fVar28,fVar43,fVar37);
                      }
                      else {
                        stbtt__handle_clipped_edge
                                  (scanline_00,iVar15,psVar14,fVar21,fVar28,fVar43,fVar37);
                        fVar28 = fVar37;
                        fVar21 = fVar43;
LAB_0010f31a:
                        stbtt__handle_clipped_edge
                                  (scanline_00,iVar15,psVar14,fVar21,fVar28,fVar36,fVar39);
                        fVar37 = fVar39;
                        fVar43 = fVar36;
                      }
LAB_0010f3d5:
                      stbtt__handle_clipped_edge
                                (scanline_00,iVar15,psVar14,fVar43,fVar37,fVar38,fVar30);
                      fVar28 = y0;
                      fVar21 = (float)local_258._0_4_;
                      iVar15 = iVar15 + 1;
                    }
                  }
                  else if (fVar21 < fVar31) {
                    if (0.0 <= fVar21) {
                      local_258 = ZEXT416((uint)fVar21);
                      stbtt__handle_clipped_edge
                                (scanline_00,(int)fVar21,psVar14,fVar21,fVar28,fVar21,fVar30);
                      iVar15 = (int)fVar21 + 1;
                      fVar28 = y0;
                      fVar21 = (float)local_258._0_4_;
                    }
                    else {
                      iVar15 = 0;
                    }
                    stbtt__handle_clipped_edge(scanline,iVar15,psVar14,fVar21,fVar28,fVar21,fVar30);
                    fVar28 = y0;
                  }
LAB_0010f613:
                }
              }
              fVar31 = 0.0;
              for (lVar9 = 0; uVar11 = (ulong)local_270->w, lVar9 < (long)uVar11; lVar9 = lVar9 + 1)
              {
                fVar31 = fVar31 + scanline[lVar9];
                iVar17 = (int)(ABS(scanline_00[lVar9] + fVar31) * 255.0 + 0.5);
                uVar4 = (uchar)iVar17;
                if (0xfe < iVar17) {
                  uVar4 = 0xff;
                }
                local_270->pixels[lVar9 + (long)(int)local_28c * (long)local_270->stride] = uVar4;
              }
              psVar14 = (stbtt__active_edge *)&active;
              while (psVar14 = psVar14->next, psVar14 != (stbtt__active_edge *)0x0) {
                psVar14->fx = psVar14->fdx + psVar14->fx;
              }
              local_290 = (float)((int)local_290 + 1);
              iVar15 = local_270->h;
              psVar25 = local_270;
              fVar31 = (float)((int)local_28c + 1);
            }
            while (puVar20 != (undefined8 *)0x0) {
              puVar20 = (undefined8 *)*puVar20;
              (**(code **)((long)userdata + 0x10))(*userdata);
            }
            if (scanline_00 != scanline_data) {
              (**(code **)((long)userdata + 0x10))(*userdata,scanline_00);
            }
            (**(code **)((long)userdata + 0x10))(*userdata,p_00);
          }
          (**(code **)((long)userdata + 0x10))(*userdata,lVar7);
          (**(code **)((long)userdata + 0x10))(*userdata,local_278);
          return;
        }
        scanline_data._0_8_ = scanline_data._0_8_ & 0xffffffff00000000;
        fVar21 = 0.0;
        fVar30 = 0.0;
        uVar16 = 0xffffffff;
        for (lVar9 = 0; fVar37 = scanline_data[0], uVar11 * 0xe - lVar9 != 0; lVar9 = lVar9 + 0xe) {
          switch((&vertices->type)[lVar9]) {
          case '\x01':
            if (-1 < (int)uVar16) {
              *(int *)(lVar7 + (ulong)uVar16 * 4) = (int)scanline_data[0] - (int)fVar31;
            }
            uVar16 = uVar16 + 1;
            auVar32 = ZEXT416(*(uint *)((long)&vertices->x + lVar9));
            auVar32 = pshuflw(auVar32,auVar32,0x60);
            fVar21 = (float)(auVar32._0_4_ >> 0x10);
            fVar30 = (float)(auVar32._4_4_ >> 0x10);
            scanline_data[0] = (float)((int)scanline_data[0] + 1);
            fVar31 = fVar37;
            if (points != (stbtt__point *)0x0) {
              points[(int)fVar37].x = fVar21;
              points[(int)fVar37].y = fVar30;
            }
            break;
          case '\x02':
            lVar19 = (long)(int)scanline_data[0];
            auVar32 = ZEXT416(*(uint *)((long)&vertices->x + lVar9));
            auVar32 = pshuflw(auVar32,auVar32,0x60);
            fVar21 = (float)(auVar32._0_4_ >> 0x10);
            fVar30 = (float)(auVar32._4_4_ >> 0x10);
            scanline_data[0] = (float)((int)scanline_data[0] + 1);
            if (points != (stbtt__point *)0x0) {
              points[lVar19].x = fVar21;
              points[lVar19].y = fVar30;
            }
            break;
          case '\x03':
            stbtt__tesselate_curve
                      (points,(int *)scanline_data,fVar21,fVar30,
                       (float)(int)*(short *)((long)&vertices->cx + lVar9),
                       (float)(int)*(short *)((long)&vertices->cy + lVar9),
                       (float)(int)*(short *)((long)&vertices->x + lVar9),
                       (float)(int)*(short *)((long)&vertices->y + lVar9),fVar28,0);
            goto LAB_0010eb48;
          case '\x04':
            stbtt__tesselate_cubic
                      (points,(int *)scanline_data,fVar21,fVar30,
                       (float)(int)*(short *)((long)&vertices->cx + lVar9),
                       (float)(int)*(short *)((long)&vertices->cy + lVar9),
                       (float)(int)*(short *)((long)&vertices->cx1 + lVar9),
                       (float)(int)*(short *)((long)&vertices->cy1 + lVar9),
                       (float)(int)*(short *)((long)&vertices->x + lVar9),
                       (float)(int)*(short *)((long)&vertices->y + lVar9),fVar28,0);
LAB_0010eb48:
            auVar32 = ZEXT416(*(uint *)((long)&vertices->x + lVar9));
            auVar32 = pshuflw(auVar32,auVar32,0x60);
            fVar21 = (float)(auVar32._0_4_ >> 0x10);
            fVar30 = (float)(auVar32._4_4_ >> 0x10);
          }
        }
        *(int *)(lVar7 + (long)(int)uVar16 * 4) = (int)scanline_data[0] - (int)fVar31;
        iVar17 = iVar17 + 1;
        fVar21 = scanline_data[0];
      } while( true );
    }
  }
  return;
}

Assistant:

STBTT_DEF void stbtt_Rasterize(stbtt__bitmap *result, float flatness_in_pixels, stbtt_vertex *vertices, int num_verts, float scale_x, float scale_y, float shift_x, float shift_y, int x_off, int y_off, int invert, void *userdata)
{
float scale            = scale_x > scale_y ? scale_y : scale_x;
int winding_count      = 0;
int *winding_lengths   = NULL;
stbtt__point *windings = stbtt_FlattenCurves(vertices, num_verts, flatness_in_pixels / scale, &winding_lengths, &winding_count, userdata);
if (windings) {
stbtt__rasterize(result, windings, winding_lengths, winding_count, scale_x, scale_y, shift_x, shift_y, x_off, y_off, invert, userdata);
STBTT_free(winding_lengths, userdata);
STBTT_free(windings, userdata);
}
}